

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randen.cc
# Opt level: O0

void __thiscall absl::lts_20250127::random_internal::Randen::Randen(Randen *this)

{
  RandenState RVar1;
  RandenState tmp;
  Randen *this_local;
  
  RVar1 = anon_unknown_0::GetRandenState();
  this->keys_ = RVar1.keys;
  this->has_crypto_ = (bool)(RVar1.has_crypto & 1);
  return;
}

Assistant:

Randen::Randen() {
  auto tmp = GetRandenState();
  keys_ = tmp.keys;
#if ABSL_RANDOM_INTERNAL_AES_DISPATCH
  has_crypto_ = tmp.has_crypto;
#endif
}